

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_ATTEST_Unmarshal(TPMS_ATTEST *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  BYTE *pBVar2;
  UINT16 UVar3;
  UINT32 UVar4;
  TPM_RC TVar5;
  UINT64 UVar6;
  TPM_RC TVar7;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar7 = 0x9a;
  TVar5 = TVar7;
  if (3 < iVar1) {
    UVar4 = ByteArrayToUint32(*buffer);
    target->magic = UVar4;
    pBVar2 = *buffer;
    *buffer = pBVar2 + 4;
    iVar1 = *size;
    *size = iVar1 + -2;
    if (1 < iVar1) {
      UVar3 = ByteArrayToUint16(pBVar2 + 4);
      target->type = UVar3;
      *buffer = *buffer + 2;
      TVar5 = TPM2B_NAME_Unmarshal(&target->qualifiedSigner,buffer,size);
      if ((((TVar5 == 0) &&
           (TVar5 = TPM2B_DATA_Unmarshal(&target->extraData,buffer,size), TVar5 == 0)) &&
          (TVar5 = TPMS_CLOCK_INFO_Unmarshal(&target->clockInfo,buffer,size), TVar5 == 0)) &&
         (iVar1 = *size, *size = iVar1 + -8, TVar5 = TVar7, 7 < iVar1)) {
        UVar6 = ByteArrayToUint64(*buffer);
        target->firmwareVersion = UVar6;
        *buffer = *buffer + 8;
        TVar5 = TPMU_ATTEST_Unmarshal(&target->attested,buffer,size,(uint)target->type);
        return TVar5;
      }
    }
  }
  return TVar5;
}

Assistant:

TPM_RC
TPMS_ATTEST_Unmarshal(TPMS_ATTEST *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_GENERATED_Unmarshal((TPM_GENERATED *)&(target->magic), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ST_ATTEST_Unmarshal((TPMI_ST_ATTEST *)&(target->type), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->qualifiedSigner), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DATA_Unmarshal((TPM2B_DATA *)&(target->extraData), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMS_CLOCK_INFO_Unmarshal((TPMS_CLOCK_INFO *)&(target->clockInfo), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT64_Unmarshal((UINT64 *)&(target->firmwareVersion), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_ATTEST_Unmarshal((TPMU_ATTEST *)&(target->attested), buffer, size, (UINT32)target->type);
    return result;
}